

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall CommandDrawString::RealignString(CommandDrawString *this)

{
  StringAlignment SVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  CommandDrawString *this_local;
  
  this->x = this->startX;
  SVar1 = this->alignment;
  if (SVar1 == ALIGN_RIGHT) {
    if (((this->super_SBarInfoCommand).script)->spacingCharacter == '\0') {
      iVar3 = FFont::StringWidth(this->font,&this->str);
      iVar2 = this->spacing;
      sVar4 = FString::Len(&this->str);
      SBarInfoCoordinate::operator-=(&this->x,iVar3 + iVar2 * (int)sVar4);
    }
    else {
      iVar3 = (*this->font->_vptr_FFont[3])
                        (this->font,
                         (ulong)(byte)((this->super_SBarInfoCommand).script)->spacingCharacter);
      iVar2 = this->spacing;
      sVar4 = FString::Len(&this->str);
      SBarInfoCoordinate::operator-=(&this->x,(iVar3 + iVar2) * (int)sVar4);
    }
  }
  else if ((SVar1 != ALIGN_LEFT) && (SVar1 == ALIGN_CENTER)) {
    if (((this->super_SBarInfoCommand).script)->spacingCharacter == '\0') {
      iVar3 = FFont::StringWidth(this->font,&this->str);
      iVar2 = this->spacing;
      sVar4 = FString::Len(&this->str);
      SBarInfoCoordinate::operator-=(&this->x,(int)((long)iVar3 + (long)iVar2 * sVar4 >> 1));
    }
    else {
      iVar3 = (*this->font->_vptr_FFont[3])
                        (this->font,
                         (ulong)(byte)((this->super_SBarInfoCommand).script)->spacingCharacter);
      iVar2 = this->spacing;
      sVar4 = FString::Len(&this->str);
      SBarInfoCoordinate::operator-=(&this->x,(int)((long)(iVar3 + iVar2) * sVar4 >> 1));
    }
  }
  return;
}

Assistant:

void RealignString()
		{
			x = startX;
			switch (alignment)
			{
			case ALIGN_LEFT:
				break;
			case ALIGN_RIGHT:
				if(script->spacingCharacter == '\0')
					x -= static_cast<int> (font->StringWidth(str)+(spacing * str.Len()));
				else //monospaced, so just multiplay the character size
					x -= static_cast<int> ((font->GetCharWidth((unsigned char) script->spacingCharacter) + spacing) * str.Len());
				break;
			case ALIGN_CENTER:
				if(script->spacingCharacter == '\0')
					x -= static_cast<int> ((font->StringWidth(str)+(spacing * str.Len())) / 2);
				else
					x -= static_cast<int> ((font->GetCharWidth((unsigned char) script->spacingCharacter) + spacing) * str.Len() / 2);
				break;
			}
		}